

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

void __thiscall
particleSamples::perform_weak_resonance_feed_down_Sigma_to_Lambda(particleSamples *this)

{
  int iVar1;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar2;
  reference ppvVar3;
  value_type *pvVar4;
  vector<particle_info,_std::allocator<particle_info>_> *this_00;
  value_type *__x;
  long in_RDI;
  particle_info daughter2;
  particle_info daughter1;
  uint i;
  uint iev;
  undefined4 local_10;
  undefined4 local_c;
  
  iVar1 = *(int *)(in_RDI + 0x610);
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (iVar1 == 0xc32) {
    local_c = 0;
    while( true ) {
      this_00 = (vector<particle_info,_std::allocator<particle_info>_> *)(ulong)local_c;
      pvVar2 = (vector<particle_info,_std::allocator<particle_info>_> *)
               std::
               vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
               ::size(*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                        **)(in_RDI + 0x6b8));
      if (pvVar2 <= this_00) break;
      local_10 = 0;
      while( true ) {
        __x = (value_type *)(ulong)local_10;
        ppvVar3 = std::
                  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                  ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                 **)(in_RDI + 0x6b8),(ulong)local_c);
        pvVar4 = (value_type *)
                 std::vector<particle_info,_std::allocator<particle_info>_>::size(*ppvVar3);
        if (pvVar4 <= __x) break;
        ppvVar3 = std::
                  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                  ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                 **)(in_RDI + 0x6b8),(ulong)local_c);
        std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                  (*ppvVar3,(ulong)local_10);
        particle_decay::perform_two_body_decay
                  ((particle_decay *)daughter1.t,(particle_info *)daughter1.z,
                   (particle_info *)daughter1.y,(particle_info *)daughter1.x);
        std::
        vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       **)(in_RDI + 0x6a0),(ulong)local_c);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back(this_00,__x);
        local_10 = local_10 + 1;
      }
      local_c = local_c + 1;
    }
  }
  return;
}

Assistant:

void particleSamples::perform_weak_resonance_feed_down_Sigma_to_Lambda() {
    if (std::abs(particle_monval) == 3122) {
        // consider Sigma^0 feed down to Lambda
        for (unsigned int iev = 0; iev < resonance_list_Sigma0->size(); iev++) {
            for (unsigned int i = 0; i < (*resonance_list_Sigma0)[iev]->size();
                 i++) {
                particle_info daughter1;
                particle_info daughter2;
                daughter1.mass = 1.116;  // mass of Lambda
                daughter2.mass = 0.0;    // mass of photon
                decayer_ptr->perform_two_body_decay(
                    (*(*resonance_list_Sigma0)[iev])[i], daughter1, daughter2);
                (*particle_list)[iev]->push_back(daughter1);
            }
        }
    }
}